

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# rpn.cpp
# Opt level: O2

stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_> *
util::rpn_parse(stack<util::variant,_std::deque<util::variant,_std::allocator<util::variant>_>_>
                *__return_storage_ptr__,string *expr)

{
  size_type sVar1;
  string tok;
  string local_90;
  undefined1 local_70 [64];
  
  std::stack<util::variant,std::deque<util::variant,std::allocator<util::variant>>>::
  stack<std::deque<util::variant,std::allocator<util::variant>>,void>(__return_storage_ptr__);
  local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
  local_90._M_string_length = 0;
  local_90.field_2._M_local_buf[0] = '\0';
  sVar1 = expr->_M_string_length;
  do {
    if ((expr->_M_dataplus)._M_p[sVar1 - 1] == ' ') {
      if (local_90._M_string_length != 0) {
        rpn_parse_str_reverse(&local_90);
        variant::variant((variant *)local_70,&local_90);
        std::deque<util::variant,_std::allocator<util::variant>_>::emplace_back<util::variant>
                  (&__return_storage_ptr__->c,(variant *)local_70);
        std::__cxx11::string::~string((string *)(local_70 + 0x10));
        local_90._M_string_length = 0;
        *local_90._M_dataplus._M_p = '\0';
      }
    }
    else {
      std::__cxx11::string::push_back((char)&local_90);
    }
    sVar1 = sVar1 - 1;
  } while (sVar1 != 0);
  if (local_90._M_string_length != 0) {
    rpn_parse_str_reverse(&local_90);
    variant::variant((variant *)local_70,&local_90);
    std::deque<util::variant,_std::allocator<util::variant>_>::emplace_back<util::variant>
              (&__return_storage_ptr__->c,(variant *)local_70);
    std::__cxx11::string::~string((string *)(local_70 + 0x10));
  }
  std::__cxx11::string::~string((string *)&local_90);
  return __return_storage_ptr__;
}

Assistant:

std::stack<util::variant> rpn_parse(std::string expr)
{
	std::stack<util::variant> stack;
	std::string tok;

	std::size_t i = expr.length() - 1;
	do
	{
		if (expr[i] != ' ')
		{
			tok += expr[i];
		}
		else if (!tok.empty())
		{
			rpn_parse_str_reverse(tok);
			stack.push(util::variant(tok));
			tok.clear();
		}
	} while (i-- != 0);

	if (!tok.empty())
	{
		rpn_parse_str_reverse(tok);
		stack.push(util::variant(tok));
	}

	return stack;
}